

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

ENetOutgoingCommand *
enet_peer_queue_outgoing_command
          (ENetPeer *peer,ENetProtocol *command,ENetPacket *packet,enet_uint32 offset,
          enet_uint16 length)

{
  enet_uint32 in_ECX;
  ENetPeer *in_RDX;
  void *in_RSI;
  enet_uint16 in_R8W;
  ENetOutgoingCommand *outgoingCommand;
  size_t in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd8;
  ENetOutgoingCommand *local_8;
  
  local_8 = (ENetOutgoingCommand *)enet_malloc(in_stack_ffffffffffffffd0);
  if (local_8 == (ENetOutgoingCommand *)0x0) {
    local_8 = (ENetOutgoingCommand *)0x0;
  }
  else {
    memcpy(&local_8->command,in_RSI,0x32);
    local_8->fragmentOffset = in_ECX;
    local_8->fragmentLength = in_R8W;
    local_8->packet = (ENetPacket *)in_RDX;
    if (in_RDX != (ENetPeer *)0x0) {
      (in_RDX->dispatchList).next =
           (_ENetListNode *)((long)&((in_RDX->dispatchList).next)->next + 1);
    }
    enet_peer_setup_outgoing_command
              (in_RDX,(ENetOutgoingCommand *)
                      CONCAT44(in_ECX,CONCAT22(in_R8W,in_stack_ffffffffffffffd8)));
  }
  return local_8;
}

Assistant:

ENetOutgoingCommand *
enet_peer_queue_outgoing_command (ENetPeer * peer, const ENetProtocol * command, ENetPacket * packet, enet_uint32 offset, enet_uint16 length)
{
    ENetOutgoingCommand * outgoingCommand = (ENetOutgoingCommand *) enet_malloc (sizeof (ENetOutgoingCommand));
    if (outgoingCommand == NULL)
      return NULL;

    outgoingCommand -> command = * command;
    outgoingCommand -> fragmentOffset = offset;
    outgoingCommand -> fragmentLength = length;
    outgoingCommand -> packet = packet;
    if (packet != NULL)
      ++ packet -> referenceCount;

    enet_peer_setup_outgoing_command (peer, outgoingCommand);

    return outgoingCommand;
}